

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

bool __thiscall cmFileCopier::CheckPermissions(cmFileCopier *this,string *arg,mode_t *permissions)

{
  cmCommand *this_00;
  bool bVar1;
  ostream *poVar2;
  ostringstream e;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  bVar1 = cmFSPermissions::stringToModeT(arg,permissions);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = std::operator<<((ostream *)local_198,this->Name);
    poVar2 = std::operator<<(poVar2," given invalid permission \"");
    poVar2 = std::operator<<(poVar2,(string *)arg);
    std::operator<<(poVar2,"\".");
    this_00 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(this_00,&sStack_1b8);
    std::__cxx11::string::~string((string *)&sStack_1b8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return bVar1;
}

Assistant:

bool cmFileCopier::CheckPermissions(std::string const& arg,
                                    mode_t& permissions)
{
  if (!cmFSPermissions::stringToModeT(arg, permissions)) {
    std::ostringstream e;
    e << this->Name << " given invalid permission \"" << arg << "\".";
    this->FileCommand->SetError(e.str());
    return false;
  }
  return true;
}